

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcValue.cpp
# Opt level: O2

bool __thiscall XmlRpc::XmlRpcValue::operator==(XmlRpcValue *this,XmlRpcValue *other)

{
  tm *ptVar1;
  __type_conflict _Var2;
  bool bVar3;
  tm *ptVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  _Self __tmp_1;
  _Self __tmp;
  bool bVar7;
  
  if (this->_type != other->_type) goto LAB_00289029;
  switch(this->_type) {
  case TypeBoolean:
    bVar7 = (this->_value).asBool == (other->_value).asBool;
    break;
  case TypeInt:
    bVar7 = (this->_value).asInt == (other->_value).asInt;
    break;
  case TypeDouble:
    bVar7 = (bool)(-((other->_value).asDouble == (this->_value).asDouble) & 1);
    break;
  case TypeString:
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (this->_value).asTime,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (other->_value).asTime);
    return _Var2;
  case TypeDateTime:
    ptVar4 = (this->_value).asTime;
    ptVar1 = (other->_value).asTime;
    if ((((ptVar4->tm_sec == ptVar1->tm_sec) && (ptVar4->tm_min == ptVar1->tm_min)) &&
        (ptVar4->tm_hour == ptVar1->tm_hour)) &&
       ((ptVar4->tm_mday == ptVar1->tm_mday && (ptVar4->tm_mon == ptVar1->tm_mon)))) {
      return ptVar4->tm_year == ptVar1->tm_year;
    }
    goto LAB_00289029;
  case TypeBase64:
    bVar7 = std::operator==((vector<char,_std::allocator<char>_> *)(this->_value).asTime,
                            (vector<char,_std::allocator<char>_> *)(other->_value).asTime);
    return bVar7;
  case TypeArray:
    bVar7 = std::operator==((vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                            (this->_value).asTime,
                            (vector<XmlRpc::XmlRpcValue,_std::allocator<XmlRpc::XmlRpcValue>_> *)
                            (other->_value).asTime);
    return bVar7;
  case TypeStruct:
    ptVar4 = (this->_value).asTime;
    if (ptVar4->tm_gmtoff == ((other->_value).asTime)->tm_gmtoff) {
      p_Var5 = *(_Rb_tree_node_base **)&ptVar4->tm_wday;
      p_Var6 = *(_Rb_tree_node_base **)&((other->_value).asTime)->tm_wday;
      while( true ) {
        bVar7 = p_Var5 == (_Rb_tree_node_base *)&ptVar4->tm_hour;
        if (bVar7) {
          return bVar7;
        }
        bVar3 = operator==((XmlRpcValue *)(p_Var5 + 2),(XmlRpcValue *)(p_Var6 + 2));
        if (!bVar3) break;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
        ptVar4 = (this->_value).asTime;
      }
      return bVar7;
    }
LAB_00289029:
    bVar7 = false;
    break;
  default:
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool XmlRpcValue::operator==(XmlRpcValue const& other) const
  {
    if (_type != other._type)
      return false;

    switch (_type) {
      case TypeBoolean:  return ( !_value.asBool && !other._value.asBool) ||
                                ( _value.asBool && other._value.asBool);
      case TypeInt:      return _value.asInt == other._value.asInt;
      case TypeDouble:   return _value.asDouble == other._value.asDouble;
      case TypeDateTime: return tmEq(*_value.asTime, *other._value.asTime);
      case TypeString:   return *_value.asString == *other._value.asString;
      case TypeBase64:   return *_value.asBinary == *other._value.asBinary;
      case TypeArray:    return *_value.asArray == *other._value.asArray;

      // The map<>::operator== requires the definition of value< for kcc
      case TypeStruct:   //return *_value.asStruct == *other._value.asStruct;
        {
          if (_value.asStruct->size() != other._value.asStruct->size())
            return false;
          
          ValueStruct::const_iterator it1=_value.asStruct->begin();
          ValueStruct::const_iterator it2=other._value.asStruct->begin();
          while (it1 != _value.asStruct->end()) {
            const XmlRpcValue& v1 = it1->second;
            const XmlRpcValue& v2 = it2->second;
            if ( ! (v1 == v2))
              return false;
            it1++;
            it2++;
          }
          return true;
        }
      default: break;
    }
    return true;    // Both invalid values ...
  }